

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_formatter_
          (base_sink<std::mutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  std::__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             &this->formatter_,
             (__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             sink_formatter);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_formatter_(std::unique_ptr<spdlog::formatter> sink_formatter)
{
    formatter_ = std::move(sink_formatter);
}